

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O2

long uv__idna_toascii(char *s,char *se,char *d,char *de)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *d_local;
  char *local_40;
  char *si;
  
  d_local = d;
  local_40 = d;
  si = s;
  while (pcVar3 = si, si < se) {
    uVar1 = uv__utf8_decode1(&si,se);
    if (uVar1 == 0xffffffff) {
      return -0x16;
    }
    if ((((uVar1 == 0x2e) || (uVar1 == 0x3002)) || (uVar1 == 0xff61)) || (uVar1 == 0xff0e)) {
      iVar2 = uv__idna_toascii_label(s,pcVar3,&d_local,de);
      if (iVar2 < 0) goto LAB_00131f75;
      s = si;
      d = d_local;
      if (d_local < de) {
        d = d_local + 1;
        *d_local = '.';
        d_local = d;
      }
    }
  }
  if ((s < se) && (iVar2 = uv__idna_toascii_label(s,se,&d_local,de), d = d_local, iVar2 < 0)) {
LAB_00131f75:
    lVar4 = (long)iVar2;
  }
  else {
    pcVar3 = d;
    if (d < de) {
      pcVar3 = d + 1;
      *d = '\0';
    }
    lVar4 = (long)pcVar3 - (long)local_40;
  }
  return lVar4;
}

Assistant:

long uv__idna_toascii(const char* s, const char* se, char* d, char* de) {
  const char* si;
  const char* st;
  unsigned c;
  char* ds;
  int rc;

  ds = d;

  si = s;
  while (si < se) {
    st = si;
    c = uv__utf8_decode1(&si, se);

    if (c == -1u)
      return UV_EINVAL;

    if (c != '.')
      if (c != 0x3002)  /* 。 */
        if (c != 0xFF0E)  /* ． */
          if (c != 0xFF61)  /* ｡ */
            continue;

    rc = uv__idna_toascii_label(s, st, &d, de);

    if (rc < 0)
      return rc;

    if (d < de)
      *d++ = '.';

    s = si;
  }

  if (s < se) {
    rc = uv__idna_toascii_label(s, se, &d, de);

    if (rc < 0)
      return rc;
  }

  if (d < de)
    *d++ = '\0';

  return d - ds;  /* Number of bytes written. */
}